

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O2

void __thiscall
CTextRender::TextDeferred(CTextRender *this,CTextCursor *pCursor,char *pText,int Length)

{
  array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *this_00;
  float fVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  CScaledGlyph *pCVar5;
  vec2 ScreenScale;
  vec2 ScreenScale_00;
  float fVar6;
  byte bVar7;
  int FontSizeIndex;
  long lVar8;
  ulong uVar9;
  int PixelSize;
  long lVar10;
  CGlyphMap *this_01;
  int iVar11;
  byte *pText_00;
  ulong uVar12;
  int NumDots;
  long in_FS_OFFSET;
  uint uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  CWordWidthHint CVar19;
  float ScreenY1;
  float ScreenX1;
  float ScreenY0;
  float ScreenX0;
  char aEllipsis [4];
  float local_b8;
  int local_80;
  float local_4c;
  undefined1 local_48 [4];
  float local_44;
  undefined1 local_40 [4];
  char local_3c [4];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((pCursor->m_Truncated == false) && (pCursor->m_SkipTextRender == false)) &&
     (this->m_pGlyphMap->m_DefaultFace != (FT_Face_conflict)0x0)) {
    uVar2 = pCursor->m_Flags;
    this_01 = (CGlyphMap *)this->m_pGraphics;
    iVar11 = this_01->m_aTextures[1].m_Id;
    (*((IInterface *)&this_01->m_pGraphics)->_vptr_IInterface[6])
              (this_01,local_40,&local_44,local_48,&local_4c);
    fVar16 = (float)iVar11 / (local_4c - local_44);
    fVar15 = pCursor->m_FontSize;
    fVar14 = fVar15 * fVar16;
    PixelSize = (int)fVar14;
    FontSizeIndex = CGlyphMap::GetFontSizeIndex(this_01,PixelSize);
    uVar3 = pCursor->m_Flags;
    uVar13 = -(uint)(pCursor->m_MaxWidth < 0.0);
    fVar6 = (float)(~uVar13 & (uint)pCursor->m_MaxWidth | uVar13 & 0x7f800000);
    iVar11 = (int)((local_4c - local_44) / fVar15);
    if (-1 < pCursor->m_MaxLines) {
      iVar11 = pCursor->m_MaxLines;
    }
    if (Length < 0) {
      Length = str_length(pText);
      fVar15 = pCursor->m_FontSize;
    }
    fVar14 = (float)(int)fVar14 / fVar16;
    fVar15 = (float)(int)((fVar15 + (pCursor->m_Advance).field_1.y) * fVar16) / fVar16;
    if (fVar15 <= pCursor->m_NextLineAdvanceY) {
      fVar15 = pCursor->m_NextLineAdvanceY;
    }
    pCursor->m_NextLineAdvanceY = fVar15;
    this_00 = &pCursor->m_Glyphs;
    pText_00 = (byte *)pText;
    while( true ) {
      bVar7 = pCursor->m_Truncated;
      if ((pText + Length <= pText_00) || ((bVar7 & 1) != 0)) goto LAB_00128cf8;
      fVar15 = (pCursor->m_Advance).field_0.x;
      ScreenScale.field_1.y = 0.0;
      ScreenScale.field_0.x = fVar15;
      CVar19 = MakeWord(this,pCursor,(char *)pText_00,pText + Length,FontSizeIndex,fVar14,PixelSize,
                        ScreenScale);
      pCursor->m_StartOfLine = false;
      if ((long)CVar19._0_8_ < 0) break;
      if (fVar6 < CVar19.m_EffectiveAdvanceX) {
        iVar4 = (pCursor->m_Glyphs).num_elements;
        lVar10 = (long)iVar4;
        if (((CVar19.m_GlyphCount == 1) && ((ulong)*pText_00 < 0x21)) &&
           ((0x100000600U >> ((ulong)*pText_00 & 0x3f) & 1) != 0)) {
          if ((uVar2 & 1) == 0) {
            array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::remove_index(this_00,iVar4 + -1);
          }
          (pCursor->m_Advance).field_0.x = fVar15;
        }
        else if (pCursor->m_LineCount < iVar11) {
          pCursor->m_LineCount = pCursor->m_LineCount + 1;
          fVar17 = (pCursor->m_Advance).field_1.y;
          fVar1 = pCursor->m_NextLineAdvanceY;
          fVar18 = pCursor->m_LineSpacing + fVar1;
          (pCursor->m_Advance).field_1.y = fVar18;
          (pCursor->m_Advance).field_0.x = (pCursor->m_Advance).field_0.x - fVar15;
          fVar18 = (float)(int)((fVar18 + pCursor->m_FontSize) * fVar16) / fVar16;
          if (fVar18 <= fVar1) {
            fVar18 = fVar1;
          }
          pCursor->m_NextLineAdvanceY = fVar18;
          if ((uVar2 & 1) == 0) {
            lVar8 = lVar10 << 6;
            for (; iVar4 - CVar19.m_GlyphCount < lVar10; lVar10 = lVar10 + -1) {
              pCVar5 = (pCursor->m_Glyphs).list;
              *(float *)((long)pCVar5 + lVar8 + -0x2c) =
                   *(float *)((long)pCVar5 + lVar8 + -0x2c) - fVar15;
              pCVar5 = (pCursor->m_Glyphs).list;
              *(float *)((long)pCVar5 + lVar8 + -0x28) =
                   ((pCursor->m_Advance).field_1.y - fVar17) +
                   *(float *)((long)pCVar5 + lVar8 + -0x28);
              *(int *)((long)(pCursor->m_Glyphs).list + lVar8 + -0x30) = pCursor->m_LineCount + -1;
              lVar8 = lVar8 + -0x40;
            }
          }
          pCursor->m_StartOfLine = false;
        }
        else {
          pCursor->m_Truncated = true;
        }
      }
      fVar15 = (pCursor->m_Advance).field_0.x;
      if (fVar15 <= pCursor->m_Width) {
        fVar15 = pCursor->m_Width;
      }
      pCursor->m_Width = fVar15;
      if ((CVar19._8_8_ >> 0x20 & 1) != 0 && (uVar3 & 2) != 0 || (CVar19._8_8_ >> 0x28 & 1) != 0) {
        if (pCursor->m_LineCount < iVar11) {
          pCursor->m_LineCount = pCursor->m_LineCount + 1;
          fVar15 = pCursor->m_NextLineAdvanceY;
          fVar17 = pCursor->m_LineSpacing + fVar15;
          (pCursor->m_Advance).field_1.y = fVar17;
          (pCursor->m_Advance).field_0.x = 0.0;
          pCursor->m_StartOfLine = true;
          fVar17 = (float)(int)((fVar17 + pCursor->m_FontSize) * fVar16) / fVar16;
          if (fVar17 <= fVar15) {
            fVar17 = fVar15;
          }
          pCursor->m_NextLineAdvanceY = fVar17;
        }
        else {
          pCursor->m_Truncated = true;
        }
      }
      pText_00 = pText_00 + (CVar19._0_8_ >> 0x20);
    }
    bVar7 = pCursor->m_Truncated;
LAB_00128cf8:
    pCursor->m_Height = fVar14 * 0.35 + pCursor->m_NextLineAdvanceY;
    local_80 = (int)pText;
    pCursor->m_CharCount = (int)pText_00 - local_80;
    if (((bVar7 & 1) != 0) && ((pCursor->m_Flags & 4) != 0)) {
      builtin_strncpy(local_3c,"…",4);
      lVar10 = (long)(pCursor->m_Glyphs).num_elements;
      if (0 < lVar10) {
        pCVar5 = (pCursor->m_Glyphs).list;
        (pCursor->m_Advance).field_0.x =
             (pCVar5[lVar10 + -1].m_pGlyph)->m_AdvanceX * pCVar5[lVar10 + -1].m_Size +
             pCVar5[lVar10 + -1].m_Advance.field_0.x;
        (pCursor->m_Advance).field_1 = pCVar5[lVar10 + -1].m_Advance.field_1;
      }
      fVar15 = pCursor->m_MaxWidth;
      pCursor->m_MaxWidth = -1.0;
      ScreenScale_00.field_1.y = 0.0;
      ScreenScale_00.field_0.x = fVar15;
      CVar19 = MakeWord(this,pCursor,local_3c,(char *)&local_38,FontSizeIndex,fVar14,PixelSize,
                        ScreenScale_00);
      pCursor->m_MaxWidth = (float)(int)fVar15;
      if (fVar6 < CVar19.m_EffectiveAdvanceX) {
        uVar9 = (ulong)(uint)(~CVar19.m_GlyphCount + (pCursor->m_Glyphs).num_elements);
        uVar12 = uVar9 << 6 | 0x14;
        local_b8 = 0.0;
        while (iVar11 = (int)uVar9, 1 < iVar11) {
          pCVar5 = this_00->list;
          fVar15 = *(float *)((long)&pCVar5->m_pGlyph + uVar12);
          if (*(float *)(*(long *)((long)pCVar5 + (uVar12 - 0x14)) + 0x2c) *
              *(float *)((long)pCVar5 + (uVar12 - 0xc)) + fVar15 <= fVar6) break;
          local_b8 = (pCursor->m_Advance).field_0.x - fVar15;
          pCursor->m_CharCount = pCursor->m_CharCount - *(int *)((long)pCVar5 + (uVar12 - 8));
          array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::remove_index(this_00,iVar11);
          uVar12 = uVar12 - 0x40;
          uVar9 = (ulong)(iVar11 - 1);
        }
        iVar11 = (pCursor->m_Glyphs).num_elements;
        lVar10 = (long)(iVar11 - CVar19.m_GlyphCount);
        uVar9 = lVar10 << 6 | 0x14;
        for (; lVar10 < iVar11; lVar10 = lVar10 + 1) {
          pCVar5 = (pCursor->m_Glyphs).list;
          *(float *)((long)&pCVar5->m_pGlyph + uVar9) =
               *(float *)((long)&pCVar5->m_pGlyph + uVar9) - local_b8;
          iVar11 = (pCursor->m_Glyphs).num_elements;
          uVar9 = uVar9 + 0x40;
        }
      }
    }
    TextRefreshGlyphs(this,pCursor);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CTextRender::TextDeferred(CTextCursor *pCursor, const char *pText, int Length)
{
	if(pCursor->m_Truncated || pCursor->m_SkipTextRender)
		return;

	if(!m_pGlyphMap->GetDefaultFace())
		return;

	bool Render = !(pCursor->m_Flags & TEXTFLAG_NO_RENDER);

	// Alignment
	float ScreenX0, ScreenY0, ScreenX1, ScreenY1;
	int ScreenWidth = Graphics()->ScreenWidth();
	int ScreenHeight = Graphics()->ScreenHeight();
	Graphics()->GetScreen(&ScreenX0, &ScreenY0, &ScreenX1, &ScreenY1);

	vec2 ScreenScale = vec2(ScreenWidth/(ScreenX1-ScreenX0), ScreenHeight/(ScreenY1-ScreenY0));
	float Size = pCursor->m_FontSize;
	int PixelSize = (int)(Size * ScreenScale.y);
	Size = PixelSize / ScreenScale.y;
	int FontSizeIndex = m_pGlyphMap->GetFontSizeIndex(PixelSize);

	// Cursor current states
	int Flags = pCursor->m_Flags;
	float MaxWidth = pCursor->m_MaxWidth;
	if(MaxWidth < 0)
		MaxWidth = INFINITY;
	int MaxLines = pCursor->m_MaxLines;
	if(MaxLines < 0)
		MaxLines = (ScreenY1-ScreenY0) / pCursor->m_FontSize;

	if(Length < 0)
		Length = str_length(pText);

	const char *pCur = (char *)pText;
	const char *pEnd = (char *)pText + Length;

	float NextAdvanceY = pCursor->m_Advance.y + pCursor->m_FontSize;
	NextAdvanceY = (int)(NextAdvanceY * ScreenScale.y) / ScreenScale.y;
	pCursor->m_NextLineAdvanceY = maximum(NextAdvanceY, pCursor->m_NextLineAdvanceY);

	while(pCur < pEnd && !pCursor->m_Truncated)
	{
		const float WordStartAdvanceX = pCursor->m_Advance.x;
		CWordWidthHint WordWidth = MakeWord(pCursor, pCur, pEnd, FontSizeIndex, Size, PixelSize, ScreenScale);
		pCursor->m_StartOfLine = false;
		if(WordWidth.m_CharCount < 0)
			break;
		
		// word wrapping
		if(WordWidth.m_EffectiveAdvanceX > MaxWidth)
		{
			const int NumGlyphs = pCursor->m_Glyphs.size();
			// do not let space create new line.
			if(WordWidth.m_GlyphCount == 1 && (*pCur == ' ' || *pCur == '\n' || *pCur == '\t'))
			{
				if(Render)
					pCursor->m_Glyphs.remove_index(NumGlyphs-1);
				pCursor->m_Advance.x = WordStartAdvanceX;
			}
			else
			{
				if(pCursor->m_LineCount < MaxLines)
				{
					pCursor->m_LineCount++;
					float AdvanceY = pCursor->m_Advance.y;
					pCursor->m_Advance.y = pCursor->m_LineSpacing + pCursor->m_NextLineAdvanceY;
					pCursor->m_Advance.x -= WordStartAdvanceX;

					float NextAdvanceY = pCursor->m_Advance.y + pCursor->m_FontSize;
					NextAdvanceY = (int)(NextAdvanceY * ScreenScale.y) / ScreenScale.y;
					pCursor->m_NextLineAdvanceY = maximum(NextAdvanceY, pCursor->m_NextLineAdvanceY);

					if(Render)
					{
						const int WordStartGlyphIndex = NumGlyphs - WordWidth.m_GlyphCount;
						for(int i = NumGlyphs - 1; i >= WordStartGlyphIndex; --i)
						{
							pCursor->m_Glyphs[i].m_Advance.x -= WordStartAdvanceX;
							pCursor->m_Glyphs[i].m_Advance.y += pCursor->m_Advance.y - AdvanceY;
							pCursor->m_Glyphs[i].m_Line = pCursor->m_LineCount - 1;
						}
					}

					pCursor->m_StartOfLine = false;
				}
				else
				{
					pCursor->m_Truncated = true;
				}
			}
		}

		pCursor->m_Width = maximum(pCursor->m_Advance.x, pCursor->m_Width);

		// newline \n
		bool ForceNewLine = WordWidth.m_EndsWithNewline && (Flags & TEXTFLAG_ALLOW_NEWLINE);
		if(ForceNewLine || WordWidth.m_IsBroken)
		{
			if(pCursor->m_LineCount < MaxLines)
			{
				pCursor->m_LineCount++;
				pCursor->m_Advance.y = pCursor->m_LineSpacing + pCursor->m_NextLineAdvanceY;
				pCursor->m_Advance.x = 0;
				pCursor->m_StartOfLine = true;

				float NextAdvanceY = pCursor->m_Advance.y + pCursor->m_FontSize;
				NextAdvanceY = (int)(NextAdvanceY * ScreenScale.y) / ScreenScale.y;
				pCursor->m_NextLineAdvanceY = maximum(NextAdvanceY, pCursor->m_NextLineAdvanceY);
			}
			else
			{
				pCursor->m_Truncated = true;
			}
		}

		pCur += WordWidth.m_CharCount;
	}

	pCursor->m_Height = pCursor->m_NextLineAdvanceY + 0.35f * Size;
	pCursor->m_CharCount = pCur - pText;

	// insert ellipsis at the end
	if(pCursor->m_Truncated && pCursor->m_Flags & TEXTFLAG_ELLIPSIS)
	{
		const char aEllipsis[] = "…";
		if(pCursor->m_Glyphs.size() > 0)
		{
			CScaledGlyph *pLastGlyph = &pCursor->m_Glyphs[pCursor->m_Glyphs.size()-1];
			pCursor->m_Advance.x = pLastGlyph->m_Advance.x + pLastGlyph->m_pGlyph->m_AdvanceX * pLastGlyph->m_Size;
			pCursor->m_Advance.y = pLastGlyph->m_Advance.y;
		}

		int OldMaxWidth = pCursor->m_MaxWidth;
		pCursor->m_MaxWidth = -1;
		CWordWidthHint WordWidth = MakeWord(pCursor, aEllipsis, aEllipsis+sizeof(aEllipsis), FontSizeIndex, Size, PixelSize, ScreenScale);
		pCursor->m_MaxWidth = OldMaxWidth;
		if(WordWidth.m_EffectiveAdvanceX > MaxWidth)
		{
			int NumDots = WordWidth.m_GlyphCount;
			int NumGlyphs = pCursor->m_Glyphs.size() - NumDots;
			float BackAdvanceX = 0;
			for(int i = NumGlyphs - 1; i > 1; --i)
			{
				CScaledGlyph *pScaled = &pCursor->m_Glyphs[i];
				if(pScaled->m_Advance.x + pScaled->m_pGlyph->m_AdvanceX * pScaled->m_Size > MaxWidth)
				{
					BackAdvanceX = pCursor->m_Advance.x - pScaled->m_Advance.x;
					pCursor->m_CharCount -= pScaled->m_NumChars;
					pCursor->m_Glyphs.remove_index(i);
				}
				else
					break;
			}
			for(int i = pCursor->m_Glyphs.size() - NumDots; i < pCursor->m_Glyphs.size(); ++i)
				pCursor->m_Glyphs[i].m_Advance.x -= BackAdvanceX;
		}
	}

	TextRefreshGlyphs(pCursor);
}